

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O2

int luaL_loadfilex(lua_State *L,char *filename,char *mode)

{
  FILE *__stream;
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  int c;
  LoadF lf;
  
  iVar1 = lua_gettop(L);
  iVar1 = iVar1 + 1;
  if (filename == (char *)0x0) {
    lua_pushstring(L,"=stdin");
    lf.f = _stdin;
  }
  else {
    lua_pushfstring(L,"@%s",filename);
    lf.f = (FILE *)fopen64(filename,"r");
    if ((FILE *)lf.f == (FILE *)0x0) {
      pcVar5 = "open";
      goto LAB_00109ac6;
    }
  }
  iVar2 = skipcomment(&lf,&c);
  if (iVar2 != 0) {
    lVar4 = (long)lf.n;
    lf.n = lf.n + 1;
    lf.buff[lVar4] = '\n';
  }
  if (filename != (char *)0x0 && c == 0x1b) {
    lf.f = (FILE *)freopen64(filename,"rb",(FILE *)lf.f);
    if ((FILE *)lf.f == (FILE *)0x0) {
      pcVar5 = "reopen";
      goto LAB_00109ac6;
    }
    skipcomment(&lf,&c);
  }
  if (c != -1) {
    lVar4 = (long)lf.n;
    lf.n = lf.n + 1;
    lf.buff[lVar4] = (char)c;
  }
  pcVar5 = lua_tolstring(L,-1,(size_t *)0x0);
  iVar2 = lua_load(L,getF,&lf,pcVar5,mode);
  __stream = lf.f;
  iVar3 = ferror((FILE *)lf.f);
  if (filename != (char *)0x0) {
    fclose((FILE *)__stream);
  }
  if (iVar3 == 0) {
    lua_rotate(L,iVar1,-1);
    lua_settop(L,-2);
    return iVar2;
  }
  lua_settop(L,iVar1);
  pcVar5 = "read";
LAB_00109ac6:
  errfile(L,pcVar5,iVar1);
  return 7;
}

Assistant:

LUALIB_API int luaL_loadfilex(lua_State *L, const char *filename,
                              const char *mode) {
    LoadF lf;
    int status, readstatus;
    int c;
    int fnameindex = lua_gettop(L) + 1;  /* index of filename on the stack */
    if (filename == NULL) {
        lua_pushliteral(L, "=stdin");
        lf.f = stdin;
    } else {
        lua_pushfstring(L, "@%s", filename);
        lf.f = fopen(filename, "r");
        if (lf.f == NULL) return errfile(L, "open", fnameindex);
    }
    if (skipcomment(&lf, &c))  /* read initial portion */
        lf.buff[lf.n++] = '\n';  /* add line to correct line numbers */
    if (c == LUA_SIGNATURE[0] && filename) {  /* binary file? */
        lf.f = freopen(filename, "rb", lf.f);  /* reopen in binary mode */
        if (lf.f == NULL) return errfile(L, "reopen", fnameindex);
        skipcomment(&lf, &c);  /* re-read initial portion */
    }
    if (c != EOF)
        lf.buff[lf.n++] = c;  /* 'c' is the first character of the stream */
    status = lua_load(L, getF, &lf, lua_tostring(L, -1), mode);
    readstatus = ferror(lf.f);
    if (filename) fclose(lf.f);  /* close file (even in case of errors) */
    if (readstatus) {
        lua_settop(L, fnameindex);  /* ignore results from 'lua_load' */
        return errfile(L, "read", fnameindex);
    }
    lua_remove(L, fnameindex);
    return status;
}